

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

void moira::sprintd(char **s,u64 value)

{
  int digits;
  u64 value_local;
  char **s_local;
  
  digits = decDigits(value);
  sprintd(s,value,digits);
  return;
}

Assistant:

static void sprintd(char *&s, u64 value)
{
    sprintd(s, value, decDigits(value));
}